

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_table.c
# Opt level: O2

int amqp_decode_table(amqp_bytes_t encoded,amqp_pool_t *pool,amqp_table_t *output,size_t *offset)

{
  ulong uVar1;
  ulong *puVar2;
  byte bVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  size_t o;
  void *__src;
  void *pvVar7;
  amqp_table_entry_t_ *__dest;
  size_t sVar8;
  int iVar9;
  size_t sVar10;
  void *pvVar11;
  ulong uVar12;
  int iVar13;
  
  pvVar11 = encoded.bytes;
  uVar12 = encoded.len;
  sVar10 = *offset;
  uVar1 = sVar10 + 4;
  *offset = uVar1;
  if (uVar12 < uVar1) {
    iVar6 = -2;
  }
  else {
    uVar4 = *(uint *)((long)pvVar11 + sVar10);
    __src = malloc(0x280);
    if (__src == (void *)0x0) {
      iVar6 = -1;
    }
    else {
      sVar10 = 0;
      iVar13 = 0x10;
      iVar9 = 0;
      do {
        uVar5 = *offset;
        if (uVar1 + (uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18
                    ) <= uVar5) {
          output->num_entries = iVar9;
          __dest = (amqp_table_entry_t_ *)amqp_pool_alloc(pool,sVar10);
          output->entries = __dest;
          if (__dest == (amqp_table_entry_t_ *)0x0 && iVar9 != 0) {
LAB_0010a7e1:
            iVar6 = -1;
          }
          else {
            memcpy(__dest,__src,sVar10);
            iVar6 = 0;
          }
          break;
        }
        sVar8 = uVar5 + 1;
        *offset = sVar8;
        if (uVar12 <= uVar5) {
LAB_0010a7b3:
          iVar6 = -2;
          break;
        }
        bVar3 = *(byte *)((long)pvVar11 + uVar5);
        if (iVar13 <= iVar9) {
          iVar13 = iVar13 * 2;
          pvVar7 = realloc(__src,(long)iVar13 * 0x28);
          if (pvVar7 == (void *)0x0) goto LAB_0010a7e1;
          sVar8 = *offset;
          __src = pvVar7;
        }
        uVar5 = sVar8 + bVar3;
        *offset = uVar5;
        if (uVar12 < uVar5) goto LAB_0010a7b3;
        puVar2 = (ulong *)((long)__src + sVar10);
        puVar2[1] = sVar8 + (long)pvVar11;
        *puVar2 = (ulong)bVar3;
        iVar6 = amqp_decode_field_value(encoded,pool,(amqp_field_value_t *)(puVar2 + 2),offset);
        iVar9 = iVar9 + 1;
        sVar10 = sVar10 + 0x28;
      } while (-1 < iVar6);
      free(__src);
    }
  }
  return iVar6;
}

Assistant:

int amqp_decode_table(amqp_bytes_t encoded,
                      amqp_pool_t *pool,
                      amqp_table_t *output,
                      size_t *offset)
{
  uint32_t tablesize;
  int num_entries = 0;
  amqp_table_entry_t *entries;
  int allocated_entries = INITIAL_TABLE_SIZE;
  size_t limit;
  int res;

  if (!amqp_decode_32(encoded, offset, &tablesize)) {
    return AMQP_STATUS_BAD_AMQP_DATA;
  }

  entries = malloc(allocated_entries * sizeof(amqp_table_entry_t));
  if (entries == NULL) {
    return AMQP_STATUS_NO_MEMORY;
  }

  limit = *offset + tablesize;
  while (*offset < limit) {
    uint8_t keylen;

    res = AMQP_STATUS_BAD_AMQP_DATA;
    if (!amqp_decode_8(encoded, offset, &keylen)) {
      goto out;
    }

    if (num_entries >= allocated_entries) {
      void *newentries;
      allocated_entries = allocated_entries * 2;
      newentries = realloc(entries, allocated_entries * sizeof(amqp_table_entry_t));
      res = AMQP_STATUS_NO_MEMORY;
      if (newentries == NULL) {
        goto out;
      }

      entries = newentries;
    }

    res = AMQP_STATUS_BAD_AMQP_DATA;
    if (!amqp_decode_bytes(encoded, offset, &entries[num_entries].key, keylen)) {
      goto out;
    }

    res = amqp_decode_field_value(encoded, pool, &entries[num_entries].value,
                                  offset);
    if (res < 0) {
      goto out;
    }

    num_entries++;
  }

  output->num_entries = num_entries;
  output->entries = amqp_pool_alloc(pool, num_entries * sizeof(amqp_table_entry_t));
  res = AMQP_STATUS_NO_MEMORY;
  /* NULL is legitimate if we requested a zero-length block. */
  if (output->entries == NULL && num_entries > 0) {
    goto out;
  }

  memcpy(output->entries, entries, num_entries * sizeof(amqp_table_entry_t));
  res = AMQP_STATUS_OK;

out:
  free(entries);
  return res;
}